

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTestDec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nVarNum;
  uint uVar3;
  char *pcVar4;
  uint local_38;
  uint local_34;
  
  Extra_UtilGetoptReset();
  nVarNum = 0xffffffff;
  local_38 = 0;
  local_34 = 0;
LAB_0022517e:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"ANvh");
    iVar1 = globalUtilOptind;
    if (iVar2 == 0x4e) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_0022521d:
        Abc_Print(-1,pcVar4);
        goto LAB_00225227;
      }
      nVarNum = atoi(argv[globalUtilOptind]);
      uVar3 = nVarNum;
    }
    else {
      if (iVar2 == -1) {
        if (globalUtilOptind + 1 == argc) {
          if (5 < nVarNum) {
            Abc_DecTest(argv[globalUtilOptind],local_38,nVarNum,local_34);
            return 0;
          }
          pcVar4 = "The number of variables cannot be less than 6.\n";
        }
        else {
          pcVar4 = "Input file is not given.\n";
        }
        Abc_Print(1,pcVar4);
        return 0;
      }
      if (iVar2 == 0x76) {
        local_34 = local_34 ^ 1;
        goto LAB_0022517e;
      }
      if (iVar2 != 0x41) goto LAB_00225227;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_0022521d;
      }
      local_38 = atoi(argv[globalUtilOptind]);
      uVar3 = local_38;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_00225227:
      Abc_Print(-2,"usage: testdec [-AN <num>] [-vh] <file>\n");
      Abc_Print(-2,"\t           testbench for Boolean decomposition algorithms\n");
      Abc_Print(-2,"\t-A <num> : decomposition algorithm [default = %d]\n",(ulong)local_38);
      Abc_Print(-2,"\t               0: none (reading and writing the file)\n");
      Abc_Print(-2,"\t               1: algebraic factoring applied to ISOP\n");
      Abc_Print(-2,"\t               2: bi-decomposition with cofactoring\n");
      Abc_Print(-2,"\t               3: disjoint-support decomposition with cofactoring\n");
      Abc_Print(-2,"\t               4: updated disjoint-support decomposition with cofactoring\n");
      Abc_Print(-2,"\t               5: enumerating decomposable variable sets\n");
      Abc_Print(-2,
                "\t               6: disjoint-support decomposition with cofactoring and boolean difference analysis\n"
               );
      Abc_Print(-2,
                "\t                  from V. Callegaro, F. S. Marranghello, M. G. A. Martins, R. P. Ribas and A. I. Reis,\n"
               );
      Abc_Print(-2,
                "\t                  \"Bottom-up disjoint-support decomposition based on cofactor and boolean difference analysis,\" ICCD\'15.\n"
               );
      Abc_Print(-2,
                "\t-N <num> : the number of support variables (binary files only) [default = unused]\n"
               );
      pcVar4 = "yes";
      if (local_34 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,
                "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n")
      ;
      Abc_Print(-2,"\t           or a binary file with an array of truth tables (in this case,\n");
      Abc_Print(-2,"\t           -N <num> is required to determine how many functions are stored)\n"
               );
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandTestDec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_DecTest( char * pFileName, int DecType, int nVarNum, int fVerbose );
    char * pFileName;
    int c;
    int fVerbose = 0;
    int DecType = 0;
    int nVarNum = -1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ANvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            DecType = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( DecType < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVarNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVarNum < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( 1,"Input file is not given.\n" );
        return 0;
    }
    if ( nVarNum >= 0 && nVarNum < 6 )
    {
        Abc_Print( 1,"The number of variables cannot be less than 6.\n" );
        return 0;
    }
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // call the testbench
    Abc_DecTest( pFileName, DecType, nVarNum, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: testdec [-AN <num>] [-vh] <file>\n" );
    Abc_Print( -2, "\t           testbench for Boolean decomposition algorithms\n" );
    Abc_Print( -2, "\t-A <num> : decomposition algorithm [default = %d]\n", DecType );
    Abc_Print( -2, "\t               0: none (reading and writing the file)\n" );
    Abc_Print( -2, "\t               1: algebraic factoring applied to ISOP\n" );
    Abc_Print( -2, "\t               2: bi-decomposition with cofactoring\n" );
    Abc_Print( -2, "\t               3: disjoint-support decomposition with cofactoring\n" );
    Abc_Print( -2, "\t               4: updated disjoint-support decomposition with cofactoring\n" );
    Abc_Print( -2, "\t               5: enumerating decomposable variable sets\n" );
    Abc_Print( -2, "\t               6: disjoint-support decomposition with cofactoring and boolean difference analysis\n" );
    Abc_Print( -2, "\t                  from V. Callegaro, F. S. Marranghello, M. G. A. Martins, R. P. Ribas and A. I. Reis,\n");
    Abc_Print( -2, "\t                  \"Bottom-up disjoint-support decomposition based on cofactor and boolean difference analysis,\" ICCD'15.\n" );
    Abc_Print( -2, "\t-N <num> : the number of support variables (binary files only) [default = unused]\n" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    Abc_Print( -2, "\t<file>   : a text file with truth tables in hexadecimal, listed one per line,\n");
    Abc_Print( -2, "\t           or a binary file with an array of truth tables (in this case,\n");
    Abc_Print( -2, "\t           -N <num> is required to determine how many functions are stored)\n");
    return 1;
}